

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O1

int main(void)

{
  int iVar1;
  undefined8 uVar2;
  cJSON *pcVar3;
  undefined8 uVar4;
  long lVar5;
  long in_FS_OFFSET;
  int ids [4];
  int numbers [3] [3];
  char *strings [7];
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined4 local_88;
  char *local_78;
  char *pcStack_70;
  char *local_68;
  char *pcStack_60;
  char *local_58;
  char *pcStack_50;
  char *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = cJSON_Version();
  printf("Version: %s\n",uVar2);
  local_48 = "Saturday";
  local_58 = "Thursday";
  pcStack_50 = "Friday";
  local_68 = "Tuesday";
  pcStack_60 = "Wednesday";
  local_78 = "Sunday";
  pcStack_70 = "Monday";
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0xffffffff00000000;
  uStack_a0 = 0x100000000;
  local_88 = 1;
  local_b8 = 0x74;
  uStack_b4 = 0x3af;
  uStack_b0 = 0xea;
  uStack_ac = 0x9789;
  pcVar3 = (cJSON *)cJSON_CreateObject();
  uVar2 = cJSON_CreateString("Jack (\"Bee\") Nimble");
  cJSON_AddItemToObject(pcVar3,"name",uVar2);
  uVar2 = cJSON_CreateObject();
  cJSON_AddItemToObject(pcVar3,"format",uVar2);
  cJSON_AddStringToObject(uVar2,"type","rect");
  cJSON_AddNumberToObject(0,uVar2,"width");
  cJSON_AddNumberToObject(0,uVar2,"height");
  cJSON_AddFalseToObject(uVar2,"interlace");
  cJSON_AddNumberToObject(0,uVar2,"frame rate");
  iVar1 = print_preallocated(pcVar3);
  cJSON_Delete(pcVar3);
  if (iVar1 == 0) {
    pcVar3 = (cJSON *)cJSON_CreateStringArray(&local_78,7);
    iVar1 = print_preallocated(pcVar3);
    cJSON_Delete(pcVar3);
    if (iVar1 == 0) {
      lVar5 = 0;
      pcVar3 = (cJSON *)cJSON_CreateArray();
      do {
        uVar2 = cJSON_CreateIntArray((long)&local_a8 + lVar5,3);
        cJSON_AddItemToArray(pcVar3,uVar2);
        lVar5 = lVar5 + 0xc;
      } while (lVar5 != 0x24);
      iVar1 = print_preallocated(pcVar3);
      cJSON_Delete(pcVar3);
      if (iVar1 == 0) {
        pcVar3 = (cJSON *)cJSON_CreateObject();
        uVar2 = cJSON_CreateObject();
        cJSON_AddItemToObject(pcVar3,"Image",uVar2);
        cJSON_AddNumberToObject(0,uVar2,"Width");
        cJSON_AddNumberToObject(0,uVar2,"Height");
        cJSON_AddStringToObject(uVar2,"Title","View from 15th Floor");
        uVar4 = cJSON_CreateObject();
        cJSON_AddItemToObject(uVar2,"Thumbnail",uVar4);
        cJSON_AddStringToObject(uVar4,"Url","http:/*www.example.com/image/481989943");
        cJSON_AddNumberToObject(0,uVar4,"Height");
        cJSON_AddStringToObject(uVar4,"Width","100");
        uVar4 = cJSON_CreateIntArray(&local_b8,4);
        cJSON_AddItemToObject(uVar2,"IDs",uVar4);
        iVar1 = print_preallocated(pcVar3);
        cJSON_Delete(pcVar3);
        if (iVar1 == 0) {
          lVar5 = 0;
          pcVar3 = (cJSON *)cJSON_CreateArray();
          do {
            uVar2 = cJSON_CreateObject();
            cJSON_AddItemToArray(pcVar3,uVar2);
            cJSON_AddStringToObject
                      (uVar2,"precision",
                       *(undefined8 *)((long)&PTR_anon_var_dwarf_c5_00103d40 + lVar5));
            cJSON_AddNumberToObject
                      ((int)*(undefined8 *)((long)&DAT_00103d48 + lVar5),uVar2,"Latitude");
            cJSON_AddNumberToObject
                      ((int)*(undefined8 *)((long)&DAT_00103d50 + lVar5),uVar2,"Longitude");
            cJSON_AddStringToObject(uVar2,"Address",*(undefined8 *)((long)&DAT_00103d58 + lVar5));
            cJSON_AddStringToObject
                      (uVar2,"City",*(undefined8 *)((long)&PTR_anon_var_dwarf_f1_00103d60 + lVar5));
            cJSON_AddStringToObject
                      (uVar2,"State",*(undefined8 *)((long)&PTR_anon_var_dwarf_107_00103d68 + lVar5)
                      );
            cJSON_AddStringToObject
                      (uVar2,"Zip",*(undefined8 *)((long)&PTR_anon_var_dwarf_11d_00103d70 + lVar5));
            cJSON_AddStringToObject
                      (uVar2,"Country",
                       *(undefined8 *)((long)&PTR_anon_var_dwarf_133_00103d78 + lVar5));
            lVar5 = lVar5 + 0x40;
          } while (lVar5 == 0x40);
          iVar1 = print_preallocated(pcVar3);
          cJSON_Delete(pcVar3);
          if (iVar1 == 0) {
            pcVar3 = (cJSON *)cJSON_CreateObject();
            cJSON_AddNumberToObject(0,pcVar3,"number");
            iVar1 = print_preallocated(pcVar3);
            cJSON_Delete(pcVar3);
            if (iVar1 == 0) {
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                return 0;
              }
              __stack_chk_fail();
            }
          }
        }
      }
    }
  }
  exit(1);
}

Assistant:

main(void)
{
    /* print the version */
    printf("Version: %s\n", cJSON_Version());

    /* Now some samplecode for building objects concisely: */
    create_objects();

    return 0;
}